

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric.cpp
# Opt level: O1

void duckdb::DecimalRoundPositivePrecisionFunction<duckdb::hugeint_t,duckdb::Hugeint>
               (DataChunk *input,ExpressionState *state,Vector *result)

{
  ulong *puVar1;
  hugeint_t *phVar2;
  data_ptr_t pdVar3;
  unsigned_long *puVar4;
  sel_t *psVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  uint64_t uVar6;
  int64_t iVar7;
  reference pvVar8;
  byte bVar9;
  bool bVar10;
  BoundFunctionExpression *pBVar11;
  pointer pFVar12;
  const_reference this_00;
  pointer pEVar13;
  long lVar14;
  TemplatedValidityData<unsigned_long> *pTVar15;
  idx_t iVar16;
  ulong uVar17;
  int64_t *piVar18;
  idx_t idx_in_entry;
  ulong uVar19;
  idx_t iVar20;
  ulong uVar21;
  ulong uVar22;
  idx_t count;
  hugeint_t hVar23;
  hugeint_t addition;
  hugeint_t local_f0;
  buffer_ptr<ValidityBuffer> *local_e0;
  hugeint_t local_d8;
  reference local_c8;
  idx_t local_c0;
  hugeint_t local_b8;
  ulong local_a0;
  UnifiedVectorFormat local_98;
  ulong local_50;
  long local_48;
  hugeint_t local_40;
  
  pBVar11 = BaseExpression::Cast<duckdb::BoundFunctionExpression>
                      (&state->expr->super_BaseExpression);
  pFVar12 = unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>::
            operator->(&pBVar11->bind_info);
  this_00 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
            ::operator[](&pBVar11->children,0);
  pEVar13 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
            operator->(this_00);
  bVar9 = DecimalType::GetScale(&pEVar13->return_type);
  lVar14 = ((ulong)bVar9 - (long)*(int *)&pFVar12[1]._vptr_FunctionData) * 0x10;
  local_b8.lower = *(uint64_t *)(Hugeint::POWERS_OF_TEN + lVar14);
  local_b8.upper = *(int64_t *)(Hugeint::POWERS_OF_TEN + lVar14 + 8);
  hugeint_t::hugeint_t((hugeint_t *)&local_98,2);
  local_f0 = hugeint_t::operator/(&local_b8,(hugeint_t *)&local_98);
  local_c8 = vector<duckdb::Vector,_true>::operator[](&input->data,0);
  count = input->count;
  if (local_c8->vector_type == FLAT_VECTOR) {
    Vector::SetVectorType(result,FLAT_VECTOR);
    pvVar8 = local_c8;
    pdVar3 = result->data;
    local_e0 = (buffer_ptr<ValidityBuffer> *)local_c8->data;
    FlatVector::VerifyFlatVector(local_c8);
    FlatVector::VerifyFlatVector(result);
    puVar4 = (pvVar8->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    if (puVar4 == (unsigned_long *)0x0) {
      if (count != 0) {
        lVar14 = 0;
        do {
          local_98.sel = *(SelectionVector **)((long)local_e0 + lVar14);
          local_98.data = *(data_ptr_t *)((data_ptr_t)((long)local_e0 + lVar14) + 8);
          hugeint_t::hugeint_t(&local_d8,0);
          bVar10 = hugeint_t::operator<((hugeint_t *)&local_98,&local_d8);
          if (bVar10) {
            hugeint_t::operator-=((hugeint_t *)&local_98,&local_f0);
          }
          else {
            hugeint_t::operator+=((hugeint_t *)&local_98,&local_f0);
          }
          hVar23 = hugeint_t::operator/((hugeint_t *)&local_98,&local_b8);
          *(uint64_t *)(pdVar3 + lVar14) = hVar23.lower;
          *(int64_t *)(pdVar3 + lVar14 + 8) = hVar23.upper;
          lVar14 = lVar14 + 0x10;
          count = count - 1;
        } while (count != 0);
      }
    }
    else {
      (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask = puVar4;
      shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator=
                (&(result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data,
                 &(pvVar8->validity).super_TemplatedValidityMask<unsigned_long>.validity_data);
      (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity =
           (pvVar8->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
      if (0x3f < count + 0x3f) {
        local_a0 = count + 0x3f >> 6;
        local_50 = 0;
        uVar19 = 0;
        local_c0 = count;
        do {
          puVar4 = (local_c8->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          if (puVar4 == (unsigned_long *)0x0) {
            uVar17 = 0xffffffffffffffff;
          }
          else {
            uVar17 = puVar4[local_50];
          }
          uVar22 = uVar19 + 0x40;
          if (count <= uVar19 + 0x40) {
            uVar22 = count;
          }
          uVar21 = uVar22;
          if (uVar17 != 0) {
            uVar21 = uVar19;
            if (uVar17 == 0xffffffffffffffff) {
              if (uVar19 < uVar22) {
                lVar14 = uVar19 << 4;
                do {
                  local_98.sel = *(SelectionVector **)((long)local_e0 + lVar14);
                  local_98.data = *(data_ptr_t *)((data_ptr_t)((long)local_e0 + lVar14) + 8);
                  hugeint_t::hugeint_t(&local_d8,0);
                  bVar10 = hugeint_t::operator<((hugeint_t *)&local_98,&local_d8);
                  if (bVar10) {
                    hugeint_t::operator-=((hugeint_t *)&local_98,&local_f0);
                  }
                  else {
                    hugeint_t::operator+=((hugeint_t *)&local_98,&local_f0);
                  }
                  hVar23 = hugeint_t::operator/((hugeint_t *)&local_98,&local_b8);
                  *(uint64_t *)(pdVar3 + lVar14) = hVar23.lower;
                  *(int64_t *)(pdVar3 + lVar14 + 8) = hVar23.upper;
                  uVar19 = uVar19 + 1;
                  lVar14 = lVar14 + 0x10;
                  uVar21 = uVar19;
                } while (uVar22 != uVar19);
              }
            }
            else {
              local_48 = uVar19 - uVar22;
              if (uVar19 < uVar22) {
                lVar14 = uVar19 << 4;
                uVar22 = 0;
                do {
                  if ((uVar17 >> (uVar22 & 0x3f) & 1) != 0) {
                    local_98.sel = *(SelectionVector **)((long)local_e0 + lVar14);
                    local_98.data = *(data_ptr_t *)((data_ptr_t)((long)local_e0 + lVar14) + 8);
                    hugeint_t::hugeint_t(&local_d8,0);
                    bVar10 = hugeint_t::operator<((hugeint_t *)&local_98,&local_d8);
                    if (bVar10) {
                      hugeint_t::operator-=((hugeint_t *)&local_98,&local_f0);
                    }
                    else {
                      hugeint_t::operator+=((hugeint_t *)&local_98,&local_f0);
                    }
                    hVar23 = hugeint_t::operator/((hugeint_t *)&local_98,&local_b8);
                    *(uint64_t *)(pdVar3 + lVar14) = hVar23.lower;
                    *(int64_t *)(pdVar3 + lVar14 + 8) = hVar23.upper;
                  }
                  uVar22 = uVar22 + 1;
                  lVar14 = lVar14 + 0x10;
                } while (local_48 + uVar22 != 0);
                uVar21 = uVar19 + uVar22;
                count = local_c0;
              }
            }
          }
          local_50 = local_50 + 1;
          uVar19 = uVar21;
        } while (local_50 != local_a0);
      }
    }
  }
  else if (local_c8->vector_type == CONSTANT_VECTOR) {
    Vector::SetVectorType(result,CONSTANT_VECTOR);
    phVar2 = (hugeint_t *)result->data;
    pdVar3 = local_c8->data;
    puVar4 = (local_c8->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    if ((puVar4 == (unsigned_long *)0x0) || ((*puVar4 & 1) != 0)) {
      ConstantVector::SetNull(result,false);
      local_98.sel = *(SelectionVector **)pdVar3;
      local_98.data = *(data_ptr_t *)(pdVar3 + 8);
      hugeint_t::hugeint_t(&local_d8,0);
      bVar10 = hugeint_t::operator<((hugeint_t *)&local_98,&local_d8);
      if (bVar10) {
        hugeint_t::operator-=((hugeint_t *)&local_98,&local_f0);
      }
      else {
        hugeint_t::operator+=((hugeint_t *)&local_98,&local_f0);
      }
      hVar23 = hugeint_t::operator/((hugeint_t *)&local_98,&local_b8);
      *phVar2 = hVar23;
    }
    else {
      ConstantVector::SetNull(result,true);
    }
  }
  else {
    UnifiedVectorFormat::UnifiedVectorFormat(&local_98);
    Vector::ToUnifiedFormat(local_c8,count,&local_98);
    Vector::SetVectorType(result,FLAT_VECTOR);
    pdVar3 = result->data;
    FlatVector::VerifyFlatVector(result);
    if (local_98.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
        (unsigned_long *)0x0) {
      if (count != 0) {
        psVar5 = (local_98.sel)->sel_vector;
        piVar18 = (int64_t *)(pdVar3 + 8);
        iVar20 = 0;
        do {
          iVar16 = iVar20;
          if (psVar5 != (sel_t *)0x0) {
            iVar16 = (idx_t)psVar5[iVar20];
          }
          local_d8.lower = *(uint64_t *)(local_98.data + iVar16 * 0x10);
          local_d8.upper = *(int64_t *)(local_98.data + iVar16 * 0x10 + 8);
          hugeint_t::hugeint_t(&local_40,0);
          bVar10 = hugeint_t::operator<(&local_d8,&local_40);
          if (bVar10) {
            hugeint_t::operator-=(&local_d8,&local_f0);
          }
          else {
            hugeint_t::operator+=(&local_d8,&local_f0);
          }
          hVar23 = hugeint_t::operator/(&local_d8,&local_b8);
          piVar18[-1] = hVar23.lower;
          *piVar18 = hVar23.upper;
          iVar20 = iVar20 + 1;
          piVar18 = piVar18 + 2;
        } while (count != iVar20);
      }
    }
    else {
      local_c0 = count;
      if (count != 0) {
        psVar5 = (local_98.sel)->sel_vector;
        local_e0 = &(result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data;
        piVar18 = (int64_t *)(pdVar3 + 8);
        uVar19 = 0;
        do {
          uVar17 = uVar19;
          if (psVar5 != (sel_t *)0x0) {
            uVar17 = (ulong)psVar5[uVar19];
          }
          if ((local_98.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
               [uVar17 >> 6] >> (uVar17 & 0x3f) & 1) == 0) {
            if ((result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                (unsigned_long *)0x0) {
              local_40.lower =
                   (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
              make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                        ((duckdb *)&local_d8,&local_40.lower);
              iVar7 = local_d8.upper;
              uVar6 = local_d8.lower;
              local_d8.lower = 0;
              local_d8.upper = 0;
              this = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                     internal.
                     super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi;
              (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr = (element_type *)uVar6;
              (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)iVar7;
              if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
              }
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8.upper !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8.upper);
              }
              pTVar15 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                  (local_e0);
              (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
                   (unsigned_long *)
                   (pTVar15->owned_data).
                   super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                   super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
                   super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                   super__Head_base<0UL,_unsigned_long_*,_false>;
            }
            bVar9 = (byte)uVar19 & 0x3f;
            puVar1 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask +
                     (uVar19 >> 6);
            *puVar1 = *puVar1 & (-2L << bVar9 | 0xfffffffffffffffeU >> 0x40 - bVar9);
          }
          else {
            local_d8.lower = *(uint64_t *)(local_98.data + uVar17 * 0x10);
            local_d8.upper = *(int64_t *)(local_98.data + uVar17 * 0x10 + 8);
            hugeint_t::hugeint_t(&local_40,0);
            bVar10 = hugeint_t::operator<(&local_d8,&local_40);
            if (bVar10) {
              hugeint_t::operator-=(&local_d8,&local_f0);
            }
            else {
              hugeint_t::operator+=(&local_d8,&local_f0);
            }
            hVar23 = hugeint_t::operator/(&local_d8,&local_b8);
            piVar18[-1] = hVar23.lower;
            *piVar18 = hVar23.upper;
          }
          uVar19 = uVar19 + 1;
          piVar18 = piVar18 + 2;
        } while (local_c0 != uVar19);
      }
    }
    if (local_98.owned_sel.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_98.owned_sel.selection_data.internal.
                 super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_98.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_98.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal
                 .
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
  }
  return;
}

Assistant:

static void DecimalRoundPositivePrecisionFunction(DataChunk &input, ExpressionState &state, Vector &result) {
	auto &func_expr = state.expr.Cast<BoundFunctionExpression>();
	auto &info = func_expr.bind_info->Cast<RoundPrecisionFunctionData>();
	auto source_scale = DecimalType::GetScale(func_expr.children[0]->return_type);
	T power_of_ten = UnsafeNumericCast<T>(POWERS_OF_TEN_CLASS::POWERS_OF_TEN[source_scale - info.target_scale]);
	T addition = power_of_ten / 2;
	UnaryExecutor::Execute<T, T>(input.data[0], result, input.size(), [&](T input) {
		if (input < 0) {
			input -= addition;
		} else {
			input += addition;
		}
		return UnsafeNumericCast<T>(input / power_of_ten);
	});
}